

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall higan::Buffer::Append(Buffer *this,char *begin,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  pointer __dest;
  
  __dest = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + this->write_idx_;
  if ((ulong)((long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__dest) < len) {
    CopyExDataToBuffer(this,begin,len);
    return;
  }
  if (len != 0) {
    memmove(__dest,begin,len);
  }
  uVar2 = len + this->write_idx_;
  uVar1 = (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar2 < uVar1) {
    uVar1 = uVar2;
  }
  this->write_idx_ = uVar1;
  return;
}

Assistant:

void Buffer::Append(const char* begin, size_t len)
{
	if (len > WritableSize())
	{
		CopyExDataToBuffer(begin, len);
	}
	else
	{
		std::copy(begin, begin + len, WriteBegin());
		AddWriteIndex(len);
	}
}